

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall VmaDedicatedAllocationList::IsEmpty(VmaDedicatedAllocationList *this)

{
  size_t sVar1;
  
  if (this->m_UseMutex == false) {
    sVar1 = (this->m_AllocationList).m_Count;
  }
  else {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
    sVar1 = (this->m_AllocationList).m_Count;
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_Mutex);
  }
  return sVar1 == 0;
}

Assistant:

bool VmaDedicatedAllocationList::IsEmpty()
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    return m_AllocationList.IsEmpty();
}